

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

bool __thiscall
ArmParser::parseThumbParameters
          (ArmParser *this,Parser *parser,tThumbOpcode *opcode,ThumbOpcodeVariables *vars)

{
  char *pcVar1;
  char cVar2;
  char symbol;
  bool bVar3;
  Token *pTVar4;
  char *pcVar5;
  long lVar6;
  undefined1 local_60 [3];
  bool optional;
  int value;
  ArmRegisterValue tempRegister;
  char *encoding;
  ThumbOpcodeVariables *vars_local;
  tThumbOpcode *opcode_local;
  Parser *parser_local;
  ArmParser *this_local;
  
  tempRegister._32_8_ = opcode->mask;
  ArmRegisterValue::ArmRegisterValue((ArmRegisterValue *)local_60);
  do {
    if (*(char *)tempRegister._32_8_ == '\0') {
      pTVar4 = Parser::nextToken(parser);
      this_local._7_1_ = pTVar4->type == Separator;
      goto LAB_001bf2da;
    }
    cVar2 = *(char *)tempRegister._32_8_;
    if (cVar2 == '/') {
      tempRegister._32_8_ = tempRegister._32_8_ + 1;
    }
    pcVar5 = (char *)(tempRegister._32_8_ + 1);
    switch(*(undefined1 *)tempRegister._32_8_) {
    case 0x44:
      tempRegister._32_8_ = pcVar5;
      bVar3 = parseRegister(this,parser,&vars->rd,0xf);
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_001bf2da;
      }
      break;
    default:
      symbol = *(char *)tempRegister._32_8_;
      tempRegister._32_8_ = pcVar5;
      bVar3 = matchSymbol(this,parser,symbol,cVar2 == '/');
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_001bf2da;
      }
      break;
    case 0x49:
    case 0x69:
      tempRegister._32_8_ = pcVar5;
      bVar3 = parseImmediate(this,parser,&vars->ImmediateExpression);
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_001bf2da;
      }
      vars->ImmediateBitLen = (int)*(char *)tempRegister._32_8_;
      tempRegister._32_8_ = tempRegister._32_8_ + 1;
      break;
    case 0x52:
      pcVar1 = (char *)(tempRegister._32_8_ + 2);
      tempRegister._32_8_ = pcVar5;
      bVar3 = parseRegisterList(this,parser,&vars->rlist,(int)*pcVar5 | (int)*pcVar1 << 8);
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_001bf2da;
      }
      tempRegister._32_8_ = tempRegister._32_8_ + 2;
      break;
    case 0x53:
      tempRegister._32_8_ = pcVar5;
      bVar3 = parseRegister(this,parser,&vars->rs,0xf);
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_001bf2da;
      }
      break;
    case 100:
      tempRegister._32_8_ = pcVar5;
      bVar3 = parseRegister(this,parser,&vars->rd,7);
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_001bf2da;
      }
      break;
    case 0x6e:
      tempRegister._32_8_ = pcVar5;
      bVar3 = parseRegister(this,parser,&vars->rn,7);
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_001bf2da;
      }
      break;
    case 0x6f:
      tempRegister._32_8_ = pcVar5;
      bVar3 = parseRegister(this,parser,&vars->ro,7);
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_001bf2da;
      }
      break;
    case 0x72:
      tempRegister._32_8_ = pcVar5;
      bVar3 = parseRegister(this,parser,(ArmRegisterValue *)local_60,0xf);
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_001bf2da;
      }
      lVar6 = tempRegister._32_8_ + 1;
      cVar2 = *(char *)tempRegister._32_8_;
      tempRegister._32_8_ = lVar6;
      if ((int)cVar2 != tempRegister.name._name.field_2._8_4_) {
        this_local._7_1_ = false;
        goto LAB_001bf2da;
      }
      break;
    case 0x73:
      tempRegister._32_8_ = pcVar5;
      bVar3 = parseRegister(this,parser,&vars->rs,7);
      if (!bVar3) {
        this_local._7_1_ = false;
LAB_001bf2da:
        ArmRegisterValue::~ArmRegisterValue((ArmRegisterValue *)local_60);
        return this_local._7_1_;
      }
    }
  } while( true );
}

Assistant:

bool ArmParser::parseThumbParameters(Parser& parser, const tThumbOpcode& opcode, ThumbOpcodeVariables& vars)
{
	const char* encoding = opcode.mask;

	ArmRegisterValue tempRegister;
	int value;

	while (*encoding != 0)
	{
		bool optional = *encoding == '/';
		if (optional)
			encoding++;

		switch (*encoding++)
		{
		case 'd': // register
			CHECK(parseRegister(parser,vars.rd,7));
			break;
		case 's': // register
			CHECK(parseRegister(parser,vars.rs,7));
			break;
		case 'n': // register
			CHECK(parseRegister(parser,vars.rn,7));
			break;
		case 'o': // register
			CHECK(parseRegister(parser,vars.ro,7));
			break;
		case 'D': // register
			CHECK(parseRegister(parser,vars.rd,15));
			break;
		case 'S': // register
			CHECK(parseRegister(parser,vars.rs,15));
			break;
		case 'r': // forced register
			CHECK(parseRegister(parser,tempRegister,15));
			CHECK(*encoding++ == tempRegister.num);
			break;
		case 'R':	// register list
			value = encoding[0] | (encoding[1] << 8);
			CHECK(parseRegisterList(parser,vars.rlist,value));
			encoding += 2;
			break;
		case 'I':	// immediate
		case 'i':
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = *encoding++;
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1),optional));
			break;
		}
	}
	
	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}